

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

void yy_1_statementlist(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *node;
  
  node = PVIP_node_new_children(&G->data,PVIP_NODE_STATEMENTS);
  G->ss = node;
  PVIP_node_push_child(node,G->val[-2]);
  G->val[-2] = G->ss;
  return;
}

Assistant:

YY_ACTION(void) yy_1_statementlist(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define s2 G->val[-1]
#define s1 G->val[-2]
  yyprintf((stderr, "do yy_1_statementlist"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
            yy = PVIP_node_new_children(&(G->data), PVIP_NODE_STATEMENTS);\n\
            PVIP_node_push_child(yy, s1);\n\
            s1 = yy;\n\
        }\n"));
  
            yy = PVIP_node_new_children(&(G->data), PVIP_NODE_STATEMENTS);
            PVIP_node_push_child(yy, s1);
            s1 = yy;
        ;
#undef s2
#undef s1
}